

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::StructUnionMemberSyntax::setChild
          (StructUnionMemberSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0048e4d4 + *(int *)(&DAT_0048e4d4 + index * 4)))();
  return;
}

Assistant:

void StructUnionMemberSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: randomQualifier = child.token(); return;
        case 2: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 3: declarators = child.node()->as<SeparatedSyntaxList<DeclaratorSyntax>>(); return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}